

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_PCR_SELECT_Unmarshal(TPMS_PCR_SELECT *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_PCR_SELECT *target_local;
  
  target_local._4_4_ = UINT8_Unmarshal(&target->sizeofSelect,buffer,size);
  if (target_local._4_4_ == 0) {
    if (target->sizeofSelect < 3) {
      target_local._4_4_ = 0x84;
    }
    else if (target->sizeofSelect < 4) {
      target_local._4_4_ =
           BYTE_Array_Unmarshal(target->pcrSelect,buffer,size,(uint)target->sizeofSelect);
    }
    else {
      target_local._4_4_ = 0x84;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_PCR_SELECT_Unmarshal(TPMS_PCR_SELECT *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT8_Unmarshal((UINT8 *)&(target->sizeofSelect), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if( (target->sizeofSelect < PCR_SELECT_MIN))
        return TPM_RC_VALUE;
    if((target->sizeofSelect) > PCR_SELECT_MAX)
        return TPM_RC_VALUE;
    result = BYTE_Array_Unmarshal((BYTE *)(target->pcrSelect), buffer, size, (INT32)(target->sizeofSelect));
    return result;
}